

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmMultiAdapterULT.cpp
# Opt level: O2

void __thiscall
CTestMA_TestMTLoadAdaptersMultipleTimes_Test::CTestMA_TestMTLoadAdaptersMultipleTimes_Test
          (CTestMA_TestMTLoadAdaptersMultipleTimes_Test *this)

{
  CTestMA::CTestMA(&this->super_CTestMA);
  (this->super_CTestMA).super_MACommonULT.super_Test._vptr_Test =
       (_func_int **)&PTR__CTestMA_001b4e60;
  return;
}

Assistant:

TEST_F(CTestMA, TestMTLoadAdaptersMultipleTimes)
{
    uint32_t       RefCount = 0;
    ThreadInParams InParams[MAX_NUM_ADAPTERS * MAX_COUNT_PER_ADAPTER];

    memset(InParams, 0, sizeof(InParams));

    //Populate the Inparams array with MAX_COUNT_PER_ADAPTER indices
    for (RefCount = 0; RefCount < MAX_COUNT_PER_ADAPTER; RefCount++)
    {
        InParams[RefCount].AdapterIdx = 0;
        InParams[RefCount].CountIdx   = RefCount;
        InParams[RefCount].MATestObj  = this;
    }
    // Create threads to load all clients i.e MAX_COUNT_PER_ADAPTER on single adpater
    CreateMAThread(MAX_COUNT_PER_ADAPTER, InParams);
}